

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib533.c
# Opt level: O2

int test(char *URL)

{
  bool bVar1;
  uint __i;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  undefined8 uVar9;
  timeval tVar10;
  undefined8 uStack_1d0;
  int maxfd;
  int running;
  timeval interval;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar9 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar9,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib533.c"
                  ,0x2c,iVar2,uVar3);
    goto LAB_00102401;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib533.c"
                  ,0x2e);
    iVar2 = 0x7c;
    goto LAB_001023ec;
  }
  iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
  uVar9 = _stderr;
  if (iVar2 == 0) {
    iVar2 = curl_easy_setopt(lVar4,0x29,1);
    uVar9 = _stderr;
    if (iVar2 != 0) {
      uVar3 = curl_easy_strerror(iVar2);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar5 = 0;
      uStack_1d0 = 0x31;
      goto LAB_001023db;
    }
    iVar2 = curl_easy_setopt(lVar4,0x2d,1);
    uVar9 = _stderr;
    if (iVar2 != 0) {
      uVar3 = curl_easy_strerror(iVar2);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar5 = 0;
      uStack_1d0 = 0x32;
      goto LAB_001023db;
    }
    lVar5 = curl_multi_init();
    if (lVar5 == 0) {
      lVar5 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib533.c"
                    ,0x34);
      iVar2 = 0x7b;
    }
    else {
      iVar2 = curl_multi_add_handle(lVar5,lVar4);
      uVar9 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_multi_strerror(iVar2);
        pcVar8 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_1d0 = 0x36;
        goto LAB_001023db;
      }
      curl_mfprintf(_stderr,"Start at URL 0\n");
      bVar1 = false;
      do {
        maxfd = -99;
        interval.tv_sec = 1;
        interval.tv_usec = 0;
        iVar2 = curl_multi_perform(lVar5,&running);
        uVar9 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          pcVar8 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uStack_1d0 = 0x42;
          goto LAB_001023db;
        }
        if (running < 0) {
          pcVar8 = 
          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
          uStack_1d0 = 0x42;
LAB_0010273f:
          curl_mfprintf(_stderr,pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib533.c"
                        ,uStack_1d0);
          iVar2 = 0x7a;
          goto LAB_001023ec;
        }
        tVar10 = tutil_tvnow();
        lVar6 = tutil_tvdiff(tVar10,tv_test_start);
        if (60000 < lVar6) {
          uStack_1d0 = 0x44;
          goto LAB_001026ee;
        }
        if (running == 0) {
          if (bVar1) {
            iVar2 = 0;
            goto LAB_001023ec;
          }
          curl_mfprintf(_stderr,"Advancing to URL 1\n");
          curl_multi_remove_handle(lVar5,lVar4);
          curl_easy_reset(lVar4);
          iVar2 = curl_easy_setopt(lVar4,0x2712,libtest_arg2);
          uVar9 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uStack_1d0 = 0x4f;
            goto LAB_001023db;
          }
          iVar2 = curl_easy_setopt(lVar4,0x29,1);
          uVar9 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uStack_1d0 = 0x50;
            goto LAB_001023db;
          }
          iVar2 = curl_easy_setopt(lVar4,0x2d,1);
          uVar9 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uStack_1d0 = 0x51;
            goto LAB_001023db;
          }
          iVar2 = curl_multi_add_handle(lVar5,lVar4);
          uVar9 = _stderr;
          bVar1 = true;
          if (iVar2 != 0) {
            uVar3 = curl_multi_strerror(iVar2);
            pcVar8 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
            uStack_1d0 = 0x54;
            goto LAB_001023db;
          }
        }
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          rd.__fds_bits[lVar6] = 0;
        }
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          wr.__fds_bits[lVar6] = 0;
        }
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          exc.__fds_bits[lVar6] = 0;
        }
        iVar2 = curl_multi_fdset(lVar5,&rd,&wr,&exc,&maxfd);
        uVar9 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          pcVar8 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
          uStack_1d0 = 0x5e;
          goto LAB_001023db;
        }
        if (maxfd < -1) {
          pcVar8 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
          uStack_1d0 = 0x5e;
          goto LAB_0010273f;
        }
        iVar2 = select_wrapper(maxfd + 1,&rd,&wr,&exc,&interval);
        if (iVar2 == -1) {
          piVar7 = __errno_location();
          uVar9 = _stderr;
          iVar2 = *piVar7;
          pcVar8 = strerror(iVar2);
          curl_mfprintf(uVar9,"%s:%d select() failed, with errno %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib533.c"
                        ,0x62,iVar2,pcVar8);
          iVar2 = 0x79;
          goto LAB_001023ec;
        }
        tVar10 = tutil_tvnow();
        lVar6 = tutil_tvdiff(tVar10,tv_test_start);
      } while (lVar6 < 0xea61);
      uStack_1d0 = 100;
LAB_001026ee:
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib533.c"
                    ,uStack_1d0);
      iVar2 = 0x7d;
    }
  }
  else {
    uVar3 = curl_easy_strerror(iVar2);
    pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    lVar5 = 0;
    uStack_1d0 = 0x30;
LAB_001023db:
    curl_mfprintf(uVar9,pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib533.c"
                  ,uStack_1d0,iVar2,uVar3);
  }
LAB_001023ec:
  curl_easy_cleanup(lVar4);
  curl_multi_cleanup(lVar5);
  curl_global_cleanup();
LAB_00102401:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  int running;
  CURLM *m = NULL;
  int current=0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_FAILONERROR, 1L);

  multi_init(m);

  multi_add_handle(m, curl);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
      if(!current++) {
        fprintf(stderr, "Advancing to URL 1\n");
        /* remove the handle we use */
        curl_multi_remove_handle(m, curl);

        /* make us re-use the same handle all the time, and try resetting
           the handle first too */
        curl_easy_reset(curl);
        easy_setopt(curl, CURLOPT_URL, libtest_arg2);
        easy_setopt(curl, CURLOPT_VERBOSE, 1L);
        easy_setopt(curl, CURLOPT_FAILONERROR, 1L);

        /* re-add it */
        multi_add_handle(m, curl);
      }
      else
        break; /* done */
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}